

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

ostream * despot::operator<<(ostream *os,
                            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            *vec)

{
  ostream *os_00;
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  _Vector_base<double,_std::allocator<double>_> _Stack_48;
  
  std::operator<<(os,"[");
  lVar3 = 0;
  for (uVar1 = 0;
      uVar1 < (ulong)(((long)(vec->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(vec->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar1 = uVar1 + 1)
  {
    pcVar2 = ", ";
    if (lVar3 == 0) {
      pcVar2 = "";
    }
    os_00 = std::operator<<(os,pcVar2);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&_Stack_48,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(((vec->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar3));
    operator<<(os_00,(vector<double,_std::allocator<double>_> *)&_Stack_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_48);
    lVar3 = lVar3 + 0x18;
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, std::vector<T> vec) {
	os << "[";
	for (int i = 0; i < vec.size(); i++)
		os << (i == 0 ? "" : ", ") << vec[i];
	os << "]";
	return os;
}